

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O1

void __thiscall
IsorecursiveTest_TestSubtypeErrors_Test::TestBody(IsorecursiveTest_TestSubtypeErrors_Test *this)

{
  undefined1 auVar1 [16];
  char *in_R9;
  pointer *__ptr;
  _Array_type *__vtable;
  Signature SVar2;
  Array AVar3;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  Type local_b0;
  Type eqref;
  Type funcref;
  Type local_98;
  Type local_90;
  Type anyref;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Stack_68;
  AssertionResult gtest_ar_;
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Stack_48;
  TypeBuilder builder;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  local_38;
  AssertHelper local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  TypeBuilder builder_3;
  
  wasm::Type::Type(&local_90,(HeapType)0x2,Nullable);
  wasm::Type::Type(&local_b0,(HeapType)0x3,Nullable);
  wasm::Type::Type(&eqref,(HeapType)0x1,Nullable);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8,2);
  wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Signature)ZEXT816(0));
  SVar2.results.id = local_90.id;
  SVar2.params.id = 1;
  wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,SVar2);
  wasm::TypeBuilder::getTempHeapType((ulong)&stack0xffffffffffffffb8);
  wasm::TypeBuilder::setSubType((ulong)&stack0xffffffffffffffb8,(HeapType)0x1);
  wasm::TypeBuilder::build();
  _Stack_68._M_head_impl._0_1_ = (internal)(local_78._M_local_buf[8] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_78._8_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_28,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&anyref);
  if (_Stack_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&anyref,(internal *)&_Stack_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x34b,(char *)anyref.id);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)anyref.id != &local_78) {
      operator_delete((void *)anyref.id,local_78._M_allocated_capacity + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8,2);
  anyref.id = local_90.id;
  wasm::Type::Type(&funcref,&anyref,2);
  wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Signature)ZEXT816(0));
  anyref.id = local_90.id;
  local_78._M_allocated_capacity = local_90.id;
  wasm::Type::Type(&local_98,&anyref,3);
  wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Signature)ZEXT816(1));
  wasm::TypeBuilder::getTempHeapType((ulong)&stack0xffffffffffffffb8);
  wasm::TypeBuilder::setSubType((ulong)&stack0xffffffffffffffb8,(HeapType)0x1);
  wasm::TypeBuilder::build();
  _Stack_68._M_head_impl._0_1_ = (internal)(local_78._M_local_buf[8] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_78._8_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_28,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&anyref);
  if (_Stack_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&anyref,(internal *)&_Stack_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x354,(char *)anyref.id);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)anyref.id != &local_78) {
      operator_delete((void *)anyref.id,local_78._M_allocated_capacity + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8,2);
  anyref.id = local_90.id;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = &anyref;
  wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,(Array)(auVar1 << 0x40));
  anyref.id = local_b0.id;
  AVar3.element._8_8_ = &anyref;
  AVar3.element.type.id = 1;
  wasm::TypeBuilder::setHeapType((ulong)&stack0xffffffffffffffb8,AVar3);
  wasm::TypeBuilder::getTempHeapType((ulong)&stack0xffffffffffffffb8);
  wasm::TypeBuilder::setSubType((ulong)&stack0xffffffffffffffb8,(HeapType)0x1);
  wasm::TypeBuilder::build();
  _Stack_68._M_head_impl._0_1_ = (internal)(local_78._M_local_buf[8] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_78._8_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_28,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&anyref);
  if (_Stack_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&anyref,(internal *)&_Stack_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x35d,(char *)anyref.id);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)anyref.id != &local_78) {
      operator_delete((void *)anyref.id,local_78._M_allocated_capacity + 1);
    }
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&stack0xffffffffffffffb8);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,2);
  anyref.id = local_90.id;
  local_78._M_allocated_capacity = local_90.id;
  local_78._8_8_ = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&anyref;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffb8,__l,
             (allocator_type *)&local_30);
  _Stack_68._M_head_impl = _Stack_48._M_head_impl;
  gtest_ar_._0_8_ =
       builder.impl._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_38.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  _Stack_48._M_head_impl = (Impl *)0x0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
  if (_Stack_68._M_head_impl != (Impl *)0x0) {
    operator_delete(_Stack_68._M_head_impl,
                    (long)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - (long)_Stack_68._M_head_impl);
  }
  if (_Stack_48._M_head_impl != (Impl *)0x0) {
    operator_delete(_Stack_48._M_head_impl,-(long)_Stack_48._M_head_impl);
  }
  anyref = eqref;
  local_78._M_allocated_capacity = local_90.id;
  local_78._8_8_ = 0;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&anyref;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffb8,__l_00,
             (allocator_type *)&local_30);
  _Stack_68._M_head_impl = _Stack_48._M_head_impl;
  gtest_ar_._0_8_ =
       builder.impl._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  _Stack_48._M_head_impl = (Impl *)0x0;
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
        )0x0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x1);
  if (_Stack_68._M_head_impl != (Impl *)0x0) {
    operator_delete(_Stack_68._M_head_impl,
                    (long)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl - (long)_Stack_68._M_head_impl);
  }
  if (_Stack_48._M_head_impl != (Impl *)0x0) {
    operator_delete(_Stack_48._M_head_impl,-(long)_Stack_48._M_head_impl);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
  wasm::TypeBuilder::build();
  _Stack_68._M_head_impl._0_1_ = (internal)(local_78._M_local_buf[8] != '\0');
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_78._8_8_ & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&stack0xffffffffffffffb8,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&anyref);
  if (_Stack_68._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffb8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&anyref,(internal *)&_Stack_68,(AssertionResult *)"builder.build()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x366,(char *)anyref.id);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&stack0xffffffffffffffb8);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)anyref.id != &local_78) {
      operator_delete((void *)anyref.id,local_78._M_allocated_capacity + 1);
    }
    if (_Stack_48._M_head_impl != (Impl *)0x0) {
      (**(code **)(*(long *)_Stack_48._M_head_impl + 8))();
    }
  }
  if (gtest_ar_._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar_._0_8_);
  }
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, TestSubtypeErrors) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);
  Type funcref = Type(HeapType::func, Nullable);

  {
    // Incompatible signatures.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, anyref);
    builder[1] = Signature(anyref, Type::none);
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Signatures incompatible in tuple size.
    TypeBuilder builder(2);
    builder[0] = Signature(Type::none, {anyref, anyref});
    builder[1] = Signature(Type::none, {anyref, anyref, anyref});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Mutable array fields are invariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Mutable));
    builder[1] = Array(Field(eqref, Mutable));
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }

  {
    // Incompatible struct prefixes
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1] = Struct({Field(funcref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    EXPECT_FALSE(builder.build());
  }
}